

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveIN(ChNodeFEAxyzD *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzD>(marchive);
  ChNodeFEAxyz::ArchiveIN(&this->super_ChNodeFEAxyz,marchive);
  local_38 = (ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0xf0;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "D";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->D_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "D_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->D_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "D_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzD>();
    // deserialize parent class
    ChNodeFEAxyz::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(D);
    marchive >> CHNVP(D_dt);
    marchive >> CHNVP(D_dtdt);
}